

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::LimitedAndReachable_Network::test_method(LimitedAndReachable_Network *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  assertion_result *in_stack_fffffffffffff6f8;
  assertion_result *this_00;
  ReachableNets *in_stack_fffffffffffff710;
  size_t in_stack_fffffffffffff718;
  assertion_result *line_num;
  ReachableNets *in_stack_fffffffffffff720;
  ReachableNets *this_01;
  unit_test_log_t *in_stack_fffffffffffff728;
  unit_test_log_t *this_02;
  const_string local_710 [2];
  lazy_ostream local_6f0 [2];
  assertion_result local_6d0 [2];
  const_string local_698 [2];
  lazy_ostream local_678 [2];
  assertion_result local_658;
  unit_test_log_t local_640 [2];
  undefined1 local_630 [48];
  lazy_ostream local_600 [2];
  assertion_result local_5e0 [2];
  const_string local_5a8 [2];
  lazy_ostream local_588 [2];
  assertion_result local_568 [2];
  const_string local_530 [2];
  lazy_ostream local_510 [2];
  assertion_result local_4f0 [2];
  const_string local_4b8 [2];
  lazy_ostream local_498 [2];
  assertion_result local_478 [2];
  const_string local_440 [2];
  lazy_ostream local_420 [2];
  assertion_result local_400 [2];
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [2];
  assertion_result local_388 [2];
  const_string local_350 [2];
  lazy_ostream local_330 [2];
  assertion_result local_310 [2];
  const_string local_2d8 [2];
  lazy_ostream local_2b8 [2];
  assertion_result local_298 [2];
  const_string local_260 [2];
  lazy_ostream local_240 [2];
  assertion_result local_220 [2];
  const_string local_1e8 [2];
  lazy_ostream local_1c8 [2];
  assertion_result local_1a8 [2];
  const_string local_170 [2];
  lazy_ostream local_150 [2];
  assertion_result local_130 [2];
  const_string local_f8 [2];
  lazy_ostream local_d8 [2];
  assertion_result local_b8 [2];
  const_string local_80 [2];
  lazy_ostream local_60 [2];
  assertion_result local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_40,local_60,local_80,0x2c8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b8,local_d8,local_f8,0x2c9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_130,local_150,local_170,0x2ca,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a8,local_1c8,local_1e8,0x2cb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_220,local_240,local_260,0x2cc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ReachableNets::Remove(in_stack_fffffffffffff710,(Network)(in_stack_fffffffffffff718 >> 0x20));
  ReachableNets::Remove(in_stack_fffffffffffff710,(Network)(in_stack_fffffffffffff718 >> 0x20));
  ReachableNets::Remove(in_stack_fffffffffffff710,(Network)(in_stack_fffffffffffff718 >> 0x20));
  ReachableNets::Remove(in_stack_fffffffffffff710,(Network)(in_stack_fffffffffffff718 >> 0x20));
  ReachableNets::Remove(in_stack_fffffffffffff710,(Network)(in_stack_fffffffffffff718 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_298,local_2b8,local_2d8,0x2d4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_310,local_330,local_350,0x2d5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_388,local_3a8,local_3c8,0x2d6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_400,local_420,local_440,0x2d7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_478,local_498,local_4b8,0x2d8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ReachableNets::Add(in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
  ReachableNets::Add(in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
  ReachableNets::Add(in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
  ReachableNets::Add(in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
  ReachableNets::Add(in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4f0,local_510,local_530,0x2e0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_568,local_588,local_5a8,0x2e1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff728,(const_string *)in_stack_fffffffffffff720,
               in_stack_fffffffffffff718,(const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains
              (in_stack_fffffffffffff720,(Network)((ulong)in_stack_fffffffffffff728 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5e0,local_600,(const_string *)(local_630 + 0x10),0x2e2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_01 = (ReachableNets *)local_630;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    this_02 = local_640;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,(const_string *)this_01,(size_t)line_num,
               (const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains(this_01,(Network)((ulong)this_02 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff6f8,(bool)in_stack_fffffffffffff6f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6f8,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_658,local_678,local_698,0x2e3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,(const_string *)this_01,(size_t)line_num,
               (const_string *)in_stack_fffffffffffff710);
    ReachableNets::Contains(this_01,(Network)((ulong)this_02 >> 0x20));
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_fffffffffffff6f7);
    in_stack_fffffffffffff710 = (ReachableNets *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
               (unsigned_long)in_stack_fffffffffffff6e8);
    in_stack_fffffffffffff6e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6d0,local_6f0,local_710,0x2e4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff6e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(LimitedAndReachable_Network)
{
    BOOST_CHECK(g_reachable_nets.Contains(NET_IPV4));
    BOOST_CHECK(g_reachable_nets.Contains(NET_IPV6));
    BOOST_CHECK(g_reachable_nets.Contains(NET_ONION));
    BOOST_CHECK(g_reachable_nets.Contains(NET_I2P));
    BOOST_CHECK(g_reachable_nets.Contains(NET_CJDNS));

    g_reachable_nets.Remove(NET_IPV4);
    g_reachable_nets.Remove(NET_IPV6);
    g_reachable_nets.Remove(NET_ONION);
    g_reachable_nets.Remove(NET_I2P);
    g_reachable_nets.Remove(NET_CJDNS);

    BOOST_CHECK(!g_reachable_nets.Contains(NET_IPV4));
    BOOST_CHECK(!g_reachable_nets.Contains(NET_IPV6));
    BOOST_CHECK(!g_reachable_nets.Contains(NET_ONION));
    BOOST_CHECK(!g_reachable_nets.Contains(NET_I2P));
    BOOST_CHECK(!g_reachable_nets.Contains(NET_CJDNS));

    g_reachable_nets.Add(NET_IPV4);
    g_reachable_nets.Add(NET_IPV6);
    g_reachable_nets.Add(NET_ONION);
    g_reachable_nets.Add(NET_I2P);
    g_reachable_nets.Add(NET_CJDNS);

    BOOST_CHECK(g_reachable_nets.Contains(NET_IPV4));
    BOOST_CHECK(g_reachable_nets.Contains(NET_IPV6));
    BOOST_CHECK(g_reachable_nets.Contains(NET_ONION));
    BOOST_CHECK(g_reachable_nets.Contains(NET_I2P));
    BOOST_CHECK(g_reachable_nets.Contains(NET_CJDNS));
}